

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_read_inner(mg_connection *conn,void *buf,size_t len)

{
  int iVar1;
  char *pcVar2;
  long local_70;
  char *local_68;
  int64_t left_to_read;
  char *body;
  int64_t len64;
  int64_t nread;
  int64_t buffered_len;
  int64_t n;
  int64_t content_len;
  size_t len_local;
  void *buf_local;
  mg_connection *conn_local;
  
  local_68 = (char *)len;
  if (0x7fffffff < len) {
    local_68 = (char *)0x7fffffff;
  }
  body = local_68;
  if (conn == (mg_connection *)0x0) {
    conn_local._4_4_ = 0;
  }
  else {
    n = conn->content_len;
    if (n < 0) {
      n = 0x7fffffffffffffff;
    }
    len64 = 0;
    if (conn->consumed_content < n) {
      pcVar2 = (char *)(n - conn->consumed_content);
      if ((long)pcVar2 < (long)local_68) {
        body = pcVar2;
      }
      nread = ((long)conn->data_len - (long)conn->request_len) - conn->consumed_content;
      len_local = (size_t)buf;
      if (0 < nread) {
        if ((long)body < nread) {
          nread = (int64_t)body;
        }
        memcpy(buf,conn->buf + conn->consumed_content + (long)conn->request_len,nread);
        body = body + -nread;
        conn->consumed_content = nread + conn->consumed_content;
        len64 = nread;
        len_local = (long)buf + nread;
      }
      iVar1 = pull_all((FILE *)0x0,conn,(char *)len_local,(int)body);
      local_70 = (long)iVar1;
      if (local_70 < 0) {
        if (0 < len64) {
          local_70 = len64;
        }
        len64 = local_70;
      }
      else {
        conn->consumed_content = local_70 + conn->consumed_content;
        len64 = local_70 + len64;
      }
    }
    conn_local._4_4_ = (int)len64;
  }
  return conn_local._4_4_;
}

Assistant:

static int
mg_read_inner(struct mg_connection *conn, void *buf, size_t len)
{
	int64_t content_len, n, buffered_len, nread;
	int64_t len64 =
	    (int64_t)((len > INT_MAX) ? INT_MAX : len); /* since the return value is
	                                                 * int, we may not read more
	                                                 * bytes */
	const char *body;

	if (conn == NULL) {
		return 0;
	}

	/* If Content-Length is not set for a response with body data,
	 * we do not know in advance how much data should be read. */
	content_len = conn->content_len;
	if (content_len < 0) {
		/* The body data is completed when the connection is closed. */
		content_len = INT64_MAX;
	}

	nread = 0;
	if (conn->consumed_content < content_len) {
		/* Adjust number of bytes to read. */
		int64_t left_to_read = content_len - conn->consumed_content;
		if (left_to_read < len64) {
			/* Do not read more than the total content length of the
			 * request.
			 */
			len64 = left_to_read;
		}

		/* Return buffered data */
		buffered_len = (int64_t)(conn->data_len) - (int64_t)conn->request_len
		               - conn->consumed_content;
		if (buffered_len > 0) {
			if (len64 < buffered_len) {
				buffered_len = len64;
			}
			body = conn->buf + conn->request_len + conn->consumed_content;
			memcpy(buf, body, (size_t)buffered_len);
			len64 -= buffered_len;
			conn->consumed_content += buffered_len;
			nread += buffered_len;
			buf = (char *)buf + buffered_len;
		}

		/* We have returned all buffered data. Read new data from the remote
		 * socket.
		 */
		if ((n = pull_all(NULL, conn, (char *)buf, (int)len64)) >= 0) {
			conn->consumed_content += n;
			nread += n;
		} else {
			nread = ((nread > 0) ? nread : n);
		}
	}
	return (int)nread;
}